

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O3

void __thiscall CMapImages::LoadMapImages(CMapImages *this,IMap *pMap,CLayers *pLayers,int MapType)

{
  IGraphics *pIVar1;
  bool bVar2;
  int *piVar3;
  CMapItemLayer *pCVar4;
  int *piVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  anon_struct_260_2_b6f809b8 *paVar10;
  int iVar11;
  anon_struct_260_2_b6f809b8 *paVar12;
  ulong uVar13;
  bool bVar14;
  long in_FS_OFFSET;
  int Start;
  char Buf [512];
  int local_23c;
  char local_238 [512];
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)MapType < 2) {
    paVar10 = this->m_Info + (uint)MapType;
    piVar3 = &this->m_Info[(uint)MapType].m_Count;
    if (0 < *piVar3) {
      lVar8 = 0;
      paVar12 = paVar10;
      do {
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,paVar12);
        lVar8 = lVar8 + 1;
        paVar12 = (anon_struct_260_2_b6f809b8 *)(paVar12->m_aTextures + 1);
      } while (lVar8 < this->m_Info[(uint)MapType].m_Count);
    }
    *piVar3 = 0;
    (*(pMap->super_IInterface)._vptr_IInterface[6])(pMap,2,&local_23c,piVar3);
    iVar11 = *piVar3;
    iVar6 = 0x40;
    if (iVar11 < 0x40) {
      iVar6 = iVar11;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    *piVar3 = iVar6;
    if (0 < iVar11) {
      uVar9 = 0;
      do {
        if (pLayers->m_LayersNum < 1) {
          uVar13 = 0;
        }
        else {
          bVar14 = false;
          bVar2 = false;
          iVar11 = 0;
          do {
            pCVar4 = CLayers::GetLayer(pLayers,iVar11);
            if (((!bVar14) && (pCVar4->m_Type == 3)) && (uVar9 == (uint)pCVar4[2].m_Version)) {
              bVar14 = true;
            }
            if (((!bVar2) && (pCVar4->m_Type == 2)) && (uVar9 == (uint)pCVar4[4].m_Type)) {
              bVar2 = true;
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < pLayers->m_LayersNum);
          uVar13 = (ulong)((uint)bVar14 * 4 + 4);
          if (!bVar2) {
            uVar13 = 0;
          }
        }
        iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[5])
                           (pMap,(ulong)(uint)(local_23c + (int)uVar9),0,0);
        piVar5 = (int *)CONCAT44(extraout_var,iVar11);
        if ((piVar5[3] == 0) && ((*piVar5 < 2 || ((uint)piVar5[6] < 2)))) {
          iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar5[5]);
          uVar7 = 1;
          if (*piVar5 != 1) {
            uVar7 = (ulong)(uint)piVar5[6];
          }
          pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          iVar11 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
                             (pIVar1,(ulong)(uint)piVar5[1],(ulong)(uint)piVar5[2],uVar7,
                              CONCAT44(extraout_var_01,iVar11),1,(int)uVar13);
          paVar10->m_aTextures[uVar9].m_Id = iVar11;
          (*(pMap->super_IInterface)._vptr_IInterface[4])(pMap,(ulong)(uint)piVar5[5]);
        }
        else {
          iVar11 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar5[4]);
          str_format(local_238,0x200,"mapres/%s.png",CONCAT44(extraout_var_00,iVar11));
          pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          iVar11 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x12])
                             (pIVar1,local_238,0xffffffff,0xffffffff,uVar13);
          paVar10->m_aTextures[uVar9].m_Id = iVar11;
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)*piVar3);
    }
    bVar2 = CGameClient::IsEaster((this->super_CComponent).m_pClient);
    if (bVar2) {
      GetEasterTexture(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapImages::LoadMapImages(IMap *pMap, class CLayers *pLayers, int MapType)
{
	if(MapType < 0 || MapType >= NUM_MAP_TYPES)
		return;

	// unload all textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
		Graphics()->UnloadTexture(&(m_Info[MapType].m_aTextures[i]));
	m_Info[MapType].m_Count = 0;

	int Start;
	pMap->GetType(MAPITEMTYPE_IMAGE, &Start, &m_Info[MapType].m_Count);
	m_Info[MapType].m_Count = clamp(m_Info[MapType].m_Count, 0, int(MAX_TEXTURES));

	// load new textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
	{
		int TextureFlags = 0;
		bool FoundQuadLayer = false;
		bool FoundTileLayer = false;
		for(int k = 0; k < pLayers->NumLayers(); k++)
		{
			const CMapItemLayer * const pLayer = pLayers->GetLayer(k);
			if(!FoundQuadLayer && pLayer->m_Type == LAYERTYPE_QUADS && ((const CMapItemLayerQuads *)pLayer)->m_Image == i)
				FoundQuadLayer = true;
			if(!FoundTileLayer && pLayer->m_Type == LAYERTYPE_TILES && ((const CMapItemLayerTilemap *)pLayer)->m_Image == i)
				FoundTileLayer = true;
		}
		if(FoundTileLayer)
			TextureFlags = FoundQuadLayer ? IGraphics::TEXLOAD_MULTI_DIMENSION : IGraphics::TEXLOAD_ARRAY_256;

		CMapItemImage *pImg = (CMapItemImage *)pMap->GetItem(Start+i, 0, 0);
		if(pImg->m_External || (pImg->m_Version > 1 && pImg->m_Format != CImageInfo::FORMAT_RGB && pImg->m_Format != CImageInfo::FORMAT_RGBA))
		{
			char Buf[IO_MAX_PATH_LENGTH];
			char *pName = (char *)pMap->GetData(pImg->m_ImageName);
			str_format(Buf, sizeof(Buf), "mapres/%s.png", pName);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTexture(Buf, IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, TextureFlags);
		}
		else
		{
			void *pData = pMap->GetData(pImg->m_ImageData);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pImg->m_Format, pData, CImageInfo::FORMAT_RGBA, TextureFlags);
			pMap->UnloadData(pImg->m_ImageData);
		}
	}

	// easter time, preload easter tileset
	if(m_pClient->IsEaster())
		GetEasterTexture();
}